

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QDomNodePrivate ** __thiscall
QMultiHash<QString,_QDomNodePrivate_*>::valueImpl<QString>
          (QMultiHash<QString,_QDomNodePrivate_*> *this,QString *key)

{
  MultiNode<QString,_QDomNodePrivate_*> *pMVar1;
  Chain *pCVar2;
  
  if (this->d != (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
    pMVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::
             findNode<QString>(this->d,key);
    if (pMVar1 == (MultiNode<QString,_QDomNodePrivate_*> *)0x0) {
      pCVar2 = (Chain *)0x0;
    }
    else {
      pCVar2 = pMVar1->value;
    }
    return &pCVar2->value;
  }
  return (QDomNodePrivate **)0x0;
}

Assistant:

T *valueImpl(const K &key) const noexcept
    {
        if (d) {
            Node *n = d->findNode(key);
            if (n) {
                Q_ASSERT(n->value);
                return &n->value->value;
            }
        }
        return nullptr;
    }